

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConfigData::ConfigData(ConfigData *this,ConfigData *param_1)

{
  pointer pcVar1;
  int iVar2;
  Level LVar3;
  OrNot OVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  
  OVar4 = param_1->showDurations;
  this->warnings = param_1->warnings;
  this->showDurations = OVar4;
  bVar5 = param_1->listTags;
  bVar6 = param_1->listReporters;
  bVar7 = param_1->showSuccessfulTests;
  bVar8 = param_1->shouldDebugBreak;
  bVar9 = param_1->noThrow;
  bVar10 = param_1->showHelp;
  uVar11 = param_1->field_0x7;
  iVar2 = param_1->abortAfter;
  LVar3 = param_1->verbosity;
  this->listTests = param_1->listTests;
  this->listTags = bVar5;
  this->listReporters = bVar6;
  this->showSuccessfulTests = bVar7;
  this->shouldDebugBreak = bVar8;
  this->noThrow = bVar9;
  this->showHelp = bVar10;
  this->field_0x7 = uVar11;
  this->abortAfter = iVar2;
  this->verbosity = LVar3;
  (this->reporterName)._M_dataplus._M_p = (pointer)&(this->reporterName).field_2;
  pcVar1 = (param_1->reporterName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->reporterName,pcVar1,pcVar1 + (param_1->reporterName)._M_string_length)
  ;
  (this->outputFilename)._M_dataplus._M_p = (pointer)&(this->outputFilename).field_2;
  pcVar1 = (param_1->outputFilename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->outputFilename,pcVar1,
             pcVar1 + (param_1->outputFilename)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  (this->processName)._M_dataplus._M_p = (pointer)&(this->processName).field_2;
  pcVar1 = (param_1->processName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->processName,pcVar1,pcVar1 + (param_1->processName)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->testsOrTags,&param_1->testsOrTags);
  return;
}

Assistant:

ConfigData()
        :   listTests( false ),
            listTags( false ),
            listReporters( false ),
            showSuccessfulTests( false ),
            shouldDebugBreak( false ),
            noThrow( false ),
            showHelp( false ),
            abortAfter( -1 ),
            verbosity( Verbosity::Normal ),
            warnings( WarnAbout::Nothing ),
            showDurations( ShowDurations::DefaultForReporter )
        {}